

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationTests.cpp
# Opt level: O2

void vkt::synchronization::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *textCtx;
  TestNode *pTVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  textCtx = (group->super_TestNode).m_testCtx;
  pTVar1 = &createSmokeTests(textCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"basic",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Basic synchronization tests",&local_5a);
  pTVar1 = &createTestGroup(textCtx,&local_38,&local_58,createBasicTests)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = (TestNode *)operator_new(0x90);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,textCtx,"op","Synchronization of a memory-modifying operation")
  ;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__OperationTests_00c0a080;
  PipelineCacheData::PipelineCacheData((PipelineCacheData *)(pTVar1 + 1));
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createInternallySynchronizedObjects(textCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext& testCtx = group->getTestContext();

	group->addChild(createSmokeTests(testCtx));
	group->addChild(createTestGroup	(testCtx, "basic", "Basic synchronization tests", createBasicTests));
	group->addChild(new OperationTests(testCtx));
	group->addChild(createInternallySynchronizedObjects(testCtx));
}